

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void clearkeys(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  Table *h;
  TValue *o;
  
  do {
    if (l == (GCObject *)0x0) {
      return;
    }
    lVar2 = *(long *)&l[1].tt;
    bVar1 = l->field_0xb;
    for (o = (TValue *)(lVar2 + 0x10);
        (Node *)(o + -1) < (Node *)((long)(1 << (bVar1 & 0x1f)) * 0x20 + lVar2); o = o + 2) {
      if (o[-1].tt_ == 0) {
LAB_00113a47:
        removeentry((Node *)(o + -1));
      }
      else {
        iVar3 = iscleared(g,o);
        if (iVar3 != 0) {
          o[-1].tt_ = 0;
          goto LAB_00113a47;
        }
        if (o[-1].tt_ == 0) goto LAB_00113a47;
      }
    }
    l = l[3].next;
  } while( true );
}

Assistant:

static void clearkeys (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && (iscleared(g, gkey(n)))) {
        setnilvalue(gval(n));  /* remove value ... */
      }
      if (ttisnil(gval(n)))  /* is entry empty? */
        removeentry(n);  /* remove entry from table */
    }
  }
}